

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

void __thiscall
cnn::FoldRows::backward_impl
          (FoldRows *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  Dim *in_RDX;
  long in_RDI;
  uint j;
  uint i_1;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> di;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  uint orows;
  Index in_stack_fffffffffffffee0;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffee8;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>_>
  *in_stack_fffffffffffffef8;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>_>
  *in_stack_ffffffffffffff00;
  Tensor *in_stack_ffffffffffffff08;
  undefined4 local_80;
  undefined4 local_7c;
  
  uVar1 = Dim::rows(in_RDX);
  Tensor::operator*(in_stack_ffffffffffffff08);
  Tensor::operator*(in_stack_ffffffffffffff08);
  for (local_7c = 0; local_7c < uVar1; local_7c = local_7c + 1) {
    for (local_80 = 0; local_80 < *(uint *)(in_RDI + 0x50); local_80 = local_80 + 1) {
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::row
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::row
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      Eigen::
      MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,1,-1,false>>
      ::operator+=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
  }
  return;
}

Assistant:

void FoldRows::backward_impl(const vector<const Tensor*>& xs,
                        const Tensor& fx,
                        const Tensor& dEdf,
                        unsigned i,
                        Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("AddVectorToAllColumns::backward not implemented for CUDA");
#else
  unsigned orows = fx.d.rows();
  auto d = *dEdf;
  auto di = *dEdxi;
  for (unsigned i = 0; i < orows; ++i)
    for (unsigned j = 0; j < nrows; ++j)
      di.row(i * nrows + j) += d.row(i);
#endif
}